

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1cmap.c
# Opt level: O2

FT_UInt t1_cmap_std_char_index(T1_CMapStd cmap,FT_UInt32 char_code)

{
  uint uVar1;
  char *__s1;
  int iVar2;
  char *__s2;
  ulong uVar3;
  
  if (char_code < 0x100) {
    __s2 = (*cmap->sid_to_string)((FT_UInt)cmap->code_to_sid[char_code]);
    uVar1 = cmap->num_glyphs;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      __s1 = cmap->glyph_names[uVar3];
      if (((__s1 != (char *)0x0) && (*__s1 == *__s2)) && (iVar2 = strcmp(__s1,__s2), iVar2 == 0)) {
        return (FT_UInt)uVar3;
      }
    }
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  t1_cmap_std_char_index( T1_CMapStd  cmap,
                          FT_UInt32   char_code )
  {
    FT_UInt  result = 0;


    if ( char_code < 256 )
    {
      FT_UInt      code, n;
      const char*  glyph_name;


      /* convert character code to Adobe SID string */
      code       = cmap->code_to_sid[char_code];
      glyph_name = cmap->sid_to_string( code );

      /* look for the corresponding glyph name */
      for ( n = 0; n < cmap->num_glyphs; n++ )
      {
        const char* gname = cmap->glyph_names[n];


        if ( gname && gname[0] == glyph_name[0]  &&
             ft_strcmp( gname, glyph_name ) == 0 )
        {
          result = n;
          break;
        }
      }
    }

    return result;
  }